

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.hpp
# Opt level: O1

void __thiscall
duckdb::BaseScanner::Process<duckdb::StringValueResult>(BaseScanner *this,StringValueResult *result)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  idx_t *piVar1;
  ulong uVar2;
  idx_t iVar3;
  char cVar4;
  char cVar5;
  byte bVar6;
  CSVState CVar7;
  CSVState CVar8;
  idx_t iVar9;
  CSVStates *pCVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  CSVStateMachine *pCVar16;
  CSVBufferHandle *pCVar17;
  idx_t *piVar18;
  idx_t iVar19;
  idx_t iVar20;
  ulong uVar21;
  
  this_00 = &this->state_machine;
  pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  cVar4 = (pCVar16->dialect_options).state_machine_options.escape.value;
  pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  if ((((pCVar16->state_machine_options).strict_mode.value == true) &&
      (pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
      (pCVar16->state_machine_options).strict_mode.set_by_user == true)) &&
     (pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
     (pCVar16->state_machine_options).new_line.value == CARRY_ON)) {
    pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    cVar5 = (pCVar16->state_machine_options).new_line.set_by_user;
  }
  else {
    cVar5 = '\0';
  }
  piVar1 = &(this->iterator).pos.buffer_pos;
  iVar9 = (this->iterator).pos.buffer_pos;
  if ((this->iterator).is_set == true) {
    iVar19 = (this->iterator).boundary.end_pos;
    pCVar17 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
    if (iVar19 <= pCVar17->actual_size) goto LAB_015174f7;
  }
  pCVar17 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
  iVar19 = pCVar17->actual_size;
LAB_015174f7:
  uVar21 = *piVar1;
  if (uVar21 < iVar19) {
    uVar2 = iVar19 - 1;
    do {
      pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      iVar20 = (this->iterator).pos.buffer_pos;
      bVar6 = this->buffer_handle_ptr[iVar20];
      CVar7 = (this->states).states[1];
      (this->states).states[0] = CVar7;
      CVar8 = pCVar16->transition_array->state_machine[bVar6][CVar7];
      (this->states).states[1] = CVar8;
      switch(CVar8) {
      case STANDARD:
        iVar3 = iVar20 + 1;
        *piVar1 = iVar3;
        uVar21 = iVar20 + 9;
        while (uVar21 < iVar19) {
          uVar21 = *(ulong *)(this->buffer_handle_ptr + iVar3);
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar16->transition_array->delimiter;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar11 = pCVar16->transition_array->new_line;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar12 = pCVar16->transition_array->carriage_return;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar13 = pCVar16->transition_array->escape;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar21 = (uVar21 ^ pCVar16->transition_array->comment) &
                   (uVar13 ^ uVar21) & (uVar12 ^ uVar21) & (uVar11 ^ uVar21) & (uVar14 ^ uVar21);
          if ((~(0x101010101010100 - uVar21 | uVar21) & 0x8080808080808080) != 0) break;
          iVar20 = *piVar1;
          iVar3 = iVar20 + 8;
          *piVar1 = iVar3;
          uVar21 = iVar20 + 0x10;
        }
        pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar21 = (this->iterator).pos.buffer_pos;
        while ((uVar21 < uVar2 &&
               (pCVar16->transition_array->skip_standard[(byte)this->buffer_handle_ptr[uVar21]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar21 + 1;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar21 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_01517854;
      case DELIMITER:
        StringValueResult::AddValue(result,iVar20);
        goto LAB_01517848;
      case RECORD_SEPARATOR:
        if (CVar7 == NOT_SET) {
LAB_01517821:
          bVar15 = StringValueResult::EmptyLine(result,iVar20);
        }
        else {
          if (CVar7 == CARRIAGE_RETURN) goto LAB_01517848;
          if (CVar7 == RECORD_SEPARATOR) goto LAB_01517821;
          if ((result->super_ScannerResult).comment != true) {
            bVar15 = StringValueResult::AddRow(result,iVar20);
            goto joined_r0x0151782e;
          }
          uVar21 = (result->super_ScannerResult).last_position.buffer_pos;
          uVar14 = result->position_before_comment;
          if (uVar21 < uVar14) {
            do {
              if (result->buffer_ptr[uVar21] != ' ') goto LAB_015179e4;
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
LAB_01517a37:
            bVar15 = false;
          }
          else {
            if (result->cur_col_id == 0) goto LAB_01517a37;
LAB_015179e4:
            bVar15 = StringValueResult::AddRow(result,uVar14);
          }
          if (result->number_of_rows == 0) {
            result->first_line_is_comment = true;
          }
          (result->super_ScannerResult).comment = false;
          (result->super_ScannerResult).last_position.buffer_pos =
               ((((result->super_ScannerResult).state_machine)->dialect_options).
                state_machine_options.new_line.value == CARRY_ON) + iVar20 + 1;
          result->cur_col_id = 0;
          result->chunk_col_id = 0;
        }
joined_r0x0151782e:
        if (bVar15 != false) goto LAB_01517a7e;
        this->lines_read = this->lines_read + 1;
LAB_01517848:
        iVar20 = *piVar1;
        break;
      case CARRIAGE_RETURN:
        if (CVar7 == NOT_SET) {
LAB_015176c9:
          bVar15 = StringValueResult::EmptyLine(result,iVar20);
joined_r0x01517a2f:
          if (bVar15 != false) {
LAB_01517a7e:
            iVar19 = (this->iterator).pos.buffer_pos + 1;
            (this->iterator).pos.buffer_pos = iVar19;
            this->bytes_read = iVar19 - iVar9;
            this->lines_read = this->lines_read + 1;
            return;
          }
        }
        else if (CVar7 != CARRIAGE_RETURN) {
          if (CVar7 == RECORD_SEPARATOR) goto LAB_015176c9;
          if ((result->super_ScannerResult).comment != true) {
            if (cVar5 != '\0') goto LAB_015176dc;
            bVar15 = StringValueResult::AddRow(result,iVar20);
            goto joined_r0x01517a2f;
          }
          uVar21 = (result->super_ScannerResult).last_position.buffer_pos;
          uVar14 = result->position_before_comment;
          if (uVar21 < uVar14) {
            do {
              if (result->buffer_ptr[uVar21] != ' ') goto LAB_015179d0;
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
LAB_015179ee:
            bVar15 = false;
          }
          else {
            if (result->cur_col_id == 0) goto LAB_015179ee;
LAB_015179d0:
            bVar15 = StringValueResult::AddRow(result,uVar14);
          }
          if (result->number_of_rows == 0) {
            result->first_line_is_comment = true;
          }
          (result->super_ScannerResult).comment = false;
          (result->super_ScannerResult).last_position.buffer_pos =
               ((((result->super_ScannerResult).state_machine)->dialect_options).
                state_machine_options.new_line.value == CARRY_ON) + iVar20 + 1;
          result->cur_col_id = 0;
          result->chunk_col_id = 0;
          goto joined_r0x01517a2f;
        }
LAB_015176dc:
        *piVar1 = *piVar1 + 1;
        iVar20 = this->lines_read;
        piVar18 = &this->lines_read;
        goto LAB_0151784e;
      case QUOTED:
        if (((CVar7 == MAYBE_QUOTED) || (CVar7 == UNQUOTED)) && (cVar4 != '\0')) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        this->ever_quoted = true;
        if ((result->super_ScannerResult).quoted == false) {
          (result->super_ScannerResult).quoted_position = iVar20;
        }
        (result->super_ScannerResult).quoted = true;
        (result->super_ScannerResult).unquoted = true;
        iVar3 = iVar20 + 1;
        *piVar1 = iVar3;
        uVar21 = iVar20 + 9;
        while (uVar21 < iVar19) {
          uVar21 = *(ulong *)(this->buffer_handle_ptr + iVar3);
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar16->transition_array->quote;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar21 = (uVar21 ^ pCVar16->transition_array->escape) & (uVar14 ^ uVar21);
          if ((~(0x101010101010100 - uVar21 | uVar21) & 0x8080808080808080) != 0) break;
          iVar20 = *piVar1;
          iVar3 = iVar20 + 8;
          *piVar1 = iVar3;
          uVar21 = iVar20 + 0x10;
        }
        pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar21 = (this->iterator).pos.buffer_pos;
        while ((uVar21 < uVar2 &&
               (pCVar16->transition_array->skip_quoted[(byte)this->buffer_handle_ptr[uVar21]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar21 + 1;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar21 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_01517854;
      case UNQUOTED:
        if (CVar7 == MAYBE_QUOTED) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        pCVar10 = (result->super_ScannerResult).states;
        if (((pCVar10->states[0] == UNQUOTED) && (pCVar10->states[1] == UNQUOTED)) &&
           ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
            escape.value != '\0')) {
          (result->super_ScannerResult).escaped = true;
        }
        (result->super_ScannerResult).quoted = true;
        break;
      case ESCAPE:
      case UNQUOTED_ESCAPE:
      case ESCAPED_RETURN:
        (result->super_ScannerResult).escaped = true;
        this->ever_escaped = true;
        break;
      case INVALID:
        StringValueResult::InvalidState(result);
        uVar21 = (this->iterator).pos.buffer_pos + 1;
        (this->iterator).pos.buffer_pos = uVar21;
        goto LAB_01517ab1;
      case QUOTED_NEW_LINE:
        result->quoted_new_line = true;
        break;
      case COMMENT:
        if ((result->super_ScannerResult).comment == false) {
          result->position_before_comment = iVar20;
          (result->super_ScannerResult).comment = true;
        }
        iVar3 = iVar20 + 1;
        *piVar1 = iVar3;
        uVar21 = iVar20 + 9;
        while (uVar21 < iVar19) {
          uVar21 = *(ulong *)(this->buffer_handle_ptr + iVar3);
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar14 = pCVar16->transition_array->new_line;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar21 = (uVar21 ^ pCVar16->transition_array->carriage_return) & (uVar14 ^ uVar21);
          if ((~(0x101010101010100 - uVar21 | uVar21) & 0x8080808080808080) != 0) break;
          iVar20 = *piVar1;
          iVar3 = iVar20 + 8;
          *piVar1 = iVar3;
          uVar21 = iVar20 + 0x10;
        }
        pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar21 = (this->iterator).pos.buffer_pos;
        while ((uVar21 < uVar2 &&
               (pCVar16->transition_array->skip_comment[(byte)this->buffer_handle_ptr[uVar21]] !=
                false))) {
          (this->iterator).pos.buffer_pos = uVar21 + 1;
          pCVar16 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar21 = (this->iterator).pos.buffer_pos;
        }
        goto LAB_01517854;
      }
      piVar18 = piVar1;
LAB_0151784e:
      *piVar18 = iVar20 + 1;
LAB_01517854:
      uVar21 = *piVar1;
    } while (uVar21 < iVar19);
  }
LAB_01517ab1:
  this->bytes_read = uVar21 - iVar9;
  return;
}

Assistant:

void Process(T &result) {
		idx_t to_pos;
		const bool has_escaped_value = state_machine->dialect_options.state_machine_options.escape != '\0';
		const bool only_rn_newlines =
		    state_machine->state_machine_options.strict_mode.GetValue() &&
		    state_machine->state_machine_options.strict_mode.IsSetByUser() &&
		    state_machine->state_machine_options.new_line.GetValue() == NewLineIdentifier::CARRY_ON &&
		    state_machine->state_machine_options.new_line.IsSetByUser();
		const idx_t start_pos = iterator.pos.buffer_pos;
		if (iterator.IsBoundarySet()) {
			to_pos = iterator.GetEndPos();
			if (to_pos > cur_buffer_handle->actual_size) {
				to_pos = cur_buffer_handle->actual_size;
			}
		} else {
			to_pos = cur_buffer_handle->actual_size;
		}
		while (iterator.pos.buffer_pos < to_pos) {
			state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
			switch (states.states[1]) {
			case CSVState::INVALID:
				T::InvalidState(result);
				iterator.pos.buffer_pos++;
				bytes_read = iterator.pos.buffer_pos - start_pos;
				return;
			case CSVState::RECORD_SEPARATOR:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
					lines_read++;

				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
					lines_read++;
				}
				iterator.pos.buffer_pos++;
				break;
			case CSVState::CARRIAGE_RETURN:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else if (!only_rn_newlines) {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				break;
			case CSVState::DELIMITER:
				T::AddValue(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::QUOTED: {
				if ((states.states[0] == CSVState::UNQUOTED || states.states[0] == CSVState::MAYBE_QUOTED) &&
				    has_escaped_value) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				ever_quoted = true;
				T::SetQuoted(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.quote) &
					                     (value ^ state_machine->transition_array.escape))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}

				while (state_machine->transition_array
				           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
			} break;
			case CSVState::UNQUOTED: {
				if (states.states[0] == CSVState::MAYBE_QUOTED) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				T::SetUnquoted(result);
				iterator.pos.buffer_pos++;
				break;
			}
			case CSVState::ESCAPE:
			case CSVState::UNQUOTED_ESCAPE:
			case CSVState::ESCAPED_RETURN:
				T::SetEscaped(result);
				ever_escaped = true;
				iterator.pos.buffer_pos++;
				break;
			case CSVState::STANDARD: {
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.delimiter) &
					                     (value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return) &
					                     (value ^ state_machine->transition_array.escape) &
					                     (value ^ state_machine->transition_array.comment))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			case CSVState::QUOTED_NEW_LINE:
				T::QuotedNewLine(result);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::COMMENT: {
				T::SetComment(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_comment[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			default:
				iterator.pos.buffer_pos++;
				break;
			}
		}
		bytes_read = iterator.pos.buffer_pos - start_pos;
	}